

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

void * icu_63::ZNames::createMetaZoneAndPutInCache
                 (UHashtable *cache,UChar **names,UnicodeString *mzID,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  UChar *key_00;
  UHashtable *this;
  undefined1 *size;
  UHashtable *local_68;
  UHashtable *local_40;
  void *value;
  void *key;
  UErrorCode *status_local;
  UnicodeString *mzID_local;
  UChar **names_local;
  UHashtable *cache_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    key_00 = ZoneMeta::findMetaZoneID(mzID);
    size = EMPTY_NAMES;
    iVar2 = memcmp(names,EMPTY_NAMES,0x38);
    if (iVar2 == 0) {
      local_40 = (UHashtable *)0x3eb4be;
    }
    else {
      this = (UHashtable *)UMemory::operator_new((UMemory *)0x40,(size_t)size);
      local_68 = (UHashtable *)0x0;
      if (this != (UHashtable *)0x0) {
        ZNames((ZNames *)this,names,(UChar *)0x0);
        local_68 = this;
      }
      local_40 = local_68;
      if (local_68 == (UHashtable *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        return (void *)0x0;
      }
    }
    uhash_put_63(cache,key_00,local_40,status);
    cache_local = local_40;
  }
  else {
    cache_local = (UHashtable *)0x0;
  }
  return cache_local;
}

Assistant:

static void* createMetaZoneAndPutInCache(UHashtable* cache, const UChar* names[],
            const UnicodeString& mzID, UErrorCode& status) {
        if (U_FAILURE(status)) { return NULL; }
        U_ASSERT(names != NULL);

        // Use the persistent ID as the resource key, so we can
        // avoid duplications.
        // TODO: Is there a more efficient way, like intern() in Java?
        void* key = (void*) ZoneMeta::findMetaZoneID(mzID);
        void* value;
        if (uprv_memcmp(names, EMPTY_NAMES, sizeof(EMPTY_NAMES)) == 0) {
            value = (void*) EMPTY;
        } else {
            value = (void*) (new ZNames(names, NULL));
            if (value == NULL) {
                status = U_MEMORY_ALLOCATION_ERROR;
                return NULL;
            }
        }
        uhash_put(cache, key, value, &status);
        return value;
    }